

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbcx.h
# Opt level: O1

void rgbcx::encode_bc1_solid_block(void *pDst,uint32_t fr,uint32_t fg,uint32_t fb,bool allow_3color)

{
  long lVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  undefined7 in_register_00000081;
  
  uVar6 = 0xffffffff;
  uVar4 = 0;
  if ((int)CONCAT71(in_register_00000081,allow_3color) != 0) {
    lVar1 = (ulong)fr * 3;
    lVar2 = (ulong)fg * 3;
    lVar3 = (ulong)fb * 3;
    if ((uint)(byte)g_bc1_match5_half[lVar3 + 2] +
        (uint)(byte)g_bc1_match6_half[lVar2 + 2] + (uint)(byte)g_bc1_match5_half[lVar1 + 2] <
        (uint)(byte)g_bc1_match5_equals_1[lVar3 + 2] +
        (uint)(byte)g_bc1_match6_equals_1[lVar2 + 2] + (uint)(byte)g_bc1_match5_equals_1[lVar1 + 2])
    {
      uVar7 = (uint)(byte)g_bc1_match5_half[lVar3] |
              (uint)(byte)g_bc1_match6_half[lVar2] << 5 |
              (uint)(byte)g_bc1_match5_half[lVar1] << 0xb;
      uVar4 = (uint)(byte)g_bc1_match5_half[lVar3 + 1] |
              (uint)(byte)g_bc1_match6_half[lVar2 + 1] << 5 |
              (uint)(byte)g_bc1_match5_half[lVar1 + 1] << 0xb;
      uVar6 = uVar4;
      if (uVar7 < uVar4) {
        uVar6 = uVar7;
      }
      if (uVar4 < uVar7) {
        uVar4 = uVar7;
      }
    }
  }
  uVar7 = 0xaa;
  if (uVar6 == 0xffffffff) {
    uVar5 = (uint)(byte)g_bc1_match5_equals_1[(ulong)fb * 3] |
            (uint)(byte)g_bc1_match6_equals_1[(ulong)fg * 3] << 5 |
            (uint)(byte)g_bc1_match5_equals_1[(ulong)fr * 3] << 0xb;
    uVar4 = (uint)(byte)g_bc1_match5_equals_1[(ulong)fb * 3 + 1] |
            (uint)(byte)g_bc1_match6_equals_1[(ulong)fg * 3 + 1] << 5 |
            (uint)(byte)g_bc1_match5_equals_1[(ulong)fr * 3 + 1] << 0xb;
    uVar7 = 0xaa;
    if (uVar4 == uVar5) {
      if (uVar4 == 0) {
        uVar7 = 0x55;
        uVar4 = 0;
        uVar5 = 1;
      }
      else {
        uVar4 = uVar4 - 1;
        uVar7 = 0;
      }
    }
    uVar6 = uVar5;
    if ((int)uVar5 < (int)uVar4) {
      uVar7 = uVar7 ^ 0x55;
      uVar6 = uVar4;
      uVar4 = uVar5;
    }
  }
  *(char *)pDst = (char)uVar6;
  *(char *)((long)pDst + 1) = (char)(uVar6 >> 8);
  *(char *)((long)pDst + 2) = (char)uVar4;
  *(char *)((long)pDst + 3) = (char)(uVar4 >> 8);
  *(uint *)((long)pDst + 4) = uVar7 * 0x1010101;
  return;
}

Assistant:

void encode_bc1_solid_block(void* pDst, uint32_t fr, uint32_t fg, uint32_t fb, bool allow_3color) 
	{
		bc1_block* pDst_block = static_cast<bc1_block*>(pDst);

		uint32_t mask = 0xAA;
		int max16 = -1, min16 = 0;

		if (allow_3color)
		{
			const uint32_t err4 = g_bc1_match5_equals_1[fr].m_e + g_bc1_match6_equals_1[fg].m_e + g_bc1_match5_equals_1[fb].m_e;
			const uint32_t err3 = g_bc1_match5_half[fr].m_e + g_bc1_match6_half[fg].m_e + g_bc1_match5_half[fb].m_e;

			if (err3 < err4)
			{
				max16 = (g_bc1_match5_half[fr].m_hi << 11) | (g_bc1_match6_half[fg].m_hi << 5) | g_bc1_match5_half[fb].m_hi;
				min16 = (g_bc1_match5_half[fr].m_lo << 11) | (g_bc1_match6_half[fg].m_lo << 5) | g_bc1_match5_half[fb].m_lo;

				if (max16 > min16)
					std::swap(max16, min16);
			}
		}

		if (max16 == -1)
		{
			max16 = (g_bc1_match5_equals_1[fr].m_hi << 11) | (g_bc1_match6_equals_1[fg].m_hi << 5) | g_bc1_match5_equals_1[fb].m_hi;
			min16 = (g_bc1_match5_equals_1[fr].m_lo << 11) | (g_bc1_match6_equals_1[fg].m_lo << 5) | g_bc1_match5_equals_1[fb].m_lo;

			if (min16 == max16)
			{
				// Always forbid 3 color blocks
				// This is to guarantee that BC3 blocks never use punchthrough alpha (3 color) mode, which isn't supported on some (all?) GPU's.
				mask = 0;

				// Make l > h
				if (min16 > 0)
					min16--;
				else
				{
					// l = h = 0
					assert(min16 == max16 && max16 == 0);

					max16 = 1;
					min16 = 0;
					mask = 0x55;
				}

				assert(max16 > min16);
			}

			if (max16 < min16)
			{
				std::swap(max16, min16);
				mask ^= 0x55;
			}
		}

		pDst_block->set_low_color(static_cast<uint16_t>(max16));
		pDst_block->set_high_color(static_cast<uint16_t>(min16));
		pDst_block->m_selectors[0] = static_cast<uint8_t>(mask);
		pDst_block->m_selectors[1] = static_cast<uint8_t>(mask);
		pDst_block->m_selectors[2] = static_cast<uint8_t>(mask);
		pDst_block->m_selectors[3] = static_cast<uint8_t>(mask);
	}